

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O2

string * __thiscall
flatbuffers::ts::TsGenerator::GenSymbolExpression
          (string *__return_storage_ptr__,TsGenerator *this,EnumDef *enum_def,bool has_name_clash,
          string *import_name,string *name,string *param_5)

{
  undefined7 in_register_00000009;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000009,has_name_clash) == 0) {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    std::operator+(&local_80,import_name," as ");
    std::operator+(&local_60,&local_80,name);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  if (enum_def->is_union == true) {
    std::operator+(&local_40,"unionTo",name);
    (*(this->namer_).super_Namer._vptr_Namer[0x14])
              (&local_80,&this->namer_,&local_40,(ulong)(this->namer_).super_Namer.config_.functions
              );
    std::operator+(&local_60,", ",&local_80);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
    std::operator+(&local_40,"unionListTo",name);
    (*(this->namer_).super_Namer._vptr_Namer[0x14])
              (&local_80,&this->namer_,&local_40,(ulong)(this->namer_).super_Namer.config_.functions
              );
    std::operator+(&local_60,", ",&local_80);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenSymbolExpression(const EnumDef &enum_def,
                                  const bool has_name_clash,
                                  const std::string &import_name,
                                  const std::string &name,
                                  const std::string &) {
    std::string symbols_expression;
    if (has_name_clash) {
      symbols_expression += import_name + " as " + name;
    } else {
      symbols_expression += name;
    }

    if (enum_def.is_union) {
      symbols_expression += (", " + namer_.Function("unionTo" + name));
      symbols_expression += (", " + namer_.Function("unionListTo" + name));
    }

    return symbols_expression;
  }